

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O0

FileName * __thiscall embree::FileName::operator+(FileName *this,FileName *other)

{
  bool bVar1;
  undefined8 in_RSI;
  char __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  FileName *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string local_58 [32];
  string *in_stack_ffffffffffffffc8;
  FileName *in_stack_ffffffffffffffd0;
  
  __rhs = (char)((ulong)in_RSI >> 0x38);
  __lhs = in_RDI;
  bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffff78);
  if (bVar1) {
    FileName((FileName *)in_RDI,in_stack_ffffffffffffff78);
  }
  else {
    std::operator+(in_stack_ffffffffffffff98,__rhs);
    std::operator+(__lhs,in_RDI);
    FileName(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    std::__cxx11::string::~string(local_58);
  }
  return (FileName *)__lhs;
}

Assistant:

FileName FileName::operator +( const FileName& other ) const {
    if (filename == "") return FileName(other);
    else return FileName(filename + path_sep + other.filename);
  }